

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UChar * __thiscall icu_63::LocDataParser::nextString(LocDataParser *this)

{
  UChar UVar1;
  UChar UVar2;
  UChar *pUVar3;
  UBool UVar4;
  bool bVar5;
  UChar *local_58;
  UChar x;
  UChar *start;
  UBool haveQuote;
  undefined1 *puStack_28;
  UChar c;
  UChar *terminators;
  UChar *result;
  LocDataParser *this_local;
  
  terminators = (UChar *)0x0;
  skipWhitespace(this);
  if (this->p < this->e) {
    UVar1 = *this->p;
    if (UVar1 != L'\"' && UVar1 != L'\'') {
      puStack_28 = NOQUOTE_STOPLIST;
    }
    else {
      inc(this);
      if (UVar1 == L'\"') {
        local_58 = L"\"";
      }
      else {
        local_58 = L"\'";
      }
      puStack_28 = (undefined1 *)local_58;
    }
    pUVar3 = this->p;
    while( true ) {
      bVar5 = false;
      if (this->p < this->e) {
        UVar4 = inList(this,*this->p,(UChar *)puStack_28);
        bVar5 = UVar4 == '\0';
      }
      if (!bVar5) break;
      this->p = this->p + 1;
    }
    if (this->p == this->e) {
      parseError(this,(char *)0x0);
      return (UChar *)0x0;
    }
    UVar2 = *this->p;
    if (pUVar3 < this->p) {
      this->ch = UVar2;
      *this->p = L'\0';
      terminators = pUVar3;
    }
    if (UVar1 != L'\"' && UVar1 != L'\'') {
      if (((UVar2 == L'<') || (UVar2 == L'\'')) || (UVar2 == L'\"')) {
        parseError(this,(char *)0x0);
        return (UChar *)0x0;
      }
    }
    else {
      if (UVar2 != UVar1) {
        parseError(this,(char *)0x0);
        return (UChar *)0x0;
      }
      if (this->p == pUVar3) {
        parseError(this,(char *)0x0);
        return (UChar *)0x0;
      }
      inc(this);
    }
  }
  return terminators;
}

Assistant:

UChar*
LocDataParser::nextString() {
    UChar* result = NULL;
    
    skipWhitespace();
    if (p < e) {
        const UChar* terminators;
        UChar c = *p;
        UBool haveQuote = c == QUOTE || c == TICK;
        if (haveQuote) {
            inc();
            terminators = c == QUOTE ? DQUOTE_STOPLIST : SQUOTE_STOPLIST;
        } else {
            terminators = NOQUOTE_STOPLIST;
        }
        UChar* start = p;
        while (p < e && !inList(*p, terminators)) ++p;
        if (p == e) {
            ERROR("Unexpected end of data");
        }
        
        UChar x = *p;
        if (p > start) {
            ch = x;
            *p = 0x0; // terminate by writing to data
            result = start; // just point into data
        }
        if (haveQuote) {
            if (x != c) {
                ERROR("Missing matching quote");
            } else if (p == start) {
                ERROR("Empty string");
            }
            inc();
        } else if (x == OPEN_ANGLE || x == TICK || x == QUOTE) {
            ERROR("Unexpected character in string");
        }
    }

    // ok for there to be no next string
    return result;
}